

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O3

void __thiscall level_tools::reconstruct_sound_envs(level_tools *this)

{
  cf_vertex_vec *verts;
  float fVar1;
  float fVar2;
  uint uVar3;
  xr_level_snd_env *pxVar4;
  pointer pcVar5;
  pointer pcVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  char *pcVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  void *__s;
  temp_box *ptVar13;
  xr_scene_sound_envs *pxVar14;
  xr_sound_env_object *this_00;
  long lVar15;
  cf_face *face;
  ulong uVar16;
  xr_custom_object_vec *this_01;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pptVar20;
  float fVar22;
  undefined1 auVar21 [16];
  float fVar24;
  undefined1 auVar23 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  xr_name_gen name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  vector<temp_box_*,_std::allocator<temp_box_*>_> boxes;
  uint local_a0;
  xr_name_gen local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  level_tools *local_68;
  cf_face *local_60;
  vector<temp_box_*,_std::allocator<temp_box_*>_> local_58;
  xr_sound_env_object *local_38;
  undefined1 auVar30 [16];
  
  pxVar4 = this->m_level->m_snd_env;
  if (pxVar4 != (xr_level_snd_env *)0x0) {
    local_68 = this;
    xray_re::msg("building %s","sound_env.part");
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::reserve
              (&local_58,
               (ulong)(((long)(pxVar4->super_xr_cform).m_faces.
                              super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar4->super_xr_cform).m_faces.
                              super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7)
               / 0xc);
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_88,0xc);
    pcVar5 = (pxVar4->super_xr_cform).m_faces.
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (pxVar4->super_xr_cform).m_faces.
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar17 = (long)pcVar6 - (long)pcVar5 >> 2;
    uVar18 = lVar17 * 0x6db6db6db6db6db7;
    uVar19 = lVar17 * -0x4924924924924924;
    __s = operator_new__(-(ulong)(uVar18 >> 0x3e != 0) | uVar19);
    if (pcVar6 != pcVar5) {
      verts = &(pxVar4->super_xr_cform).m_vertices;
      memset(__s,0xff,uVar19);
      do {
        lVar17 = uVar18 * 4;
        uVar18 = uVar18 - 1;
        if (*(int *)((long)__s + lVar17 + -4) == -1) {
          local_a0 = (uint)uVar18;
          bVar11 = true;
          while( true ) {
            uVar19 = (ulong)local_a0;
            face = (pxVar4->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar19;
            if (bVar11) {
              ptVar13 = (temp_box *)operator_new(0x4c);
              temp_box::temp_box(ptVar13,face,verts);
              local_98.m_name = (char *)ptVar13;
              std::vector<temp_box*,std::allocator<temp_box*>>::emplace_back<temp_box*>
                        ((vector<temp_box*,std::allocator<temp_box*>> *)&local_58,
                         (temp_box **)&local_98);
            }
            else {
              temp_box::collect(local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1],face,verts);
            }
            *(undefined4 *)((long)__s + uVar19 * 4) = 0;
            lVar17 = 3;
            local_60 = face;
            do {
              uVar3 = *(uint *)((long)local_60 + lVar17 * 4 + -4);
              uVar12 = (verts->
                       super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar3].face0;
              while (uVar12 != 0xffffffff) {
                uVar16 = (ulong)uVar12;
                if ((uVar19 != uVar16) && (*(int *)((long)__s + uVar16 * 4) == -1)) {
                  local_98.m_name = (char *)CONCAT44(local_98.m_name._4_4_,uVar12);
                  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_88,
                               (iterator)
                               local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_98);
                  }
                  else {
                    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish = uVar12;
                    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish =
                         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  *(undefined4 *)((long)__s + uVar16 * 4) = 0xffffffff;
                }
                pcVar5 = (pxVar4->super_xr_cform).m_faces.
                         super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                lVar10 = 3;
                do {
                  lVar15 = lVar10;
                  if (lVar15 == 0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_cform.h"
                                  ,0x65,
                                  "uint_fast32_t xray_re::cf_face::next_face_idx(uint_fast32_t) const"
                                 );
                  }
                  lVar10 = lVar15 + -1;
                } while (*(uint *)((long)pcVar5 + (lVar15 + -1) * 4 + uVar16 * 0x1c) != uVar3);
                uVar12 = *(uint *)((long)&pcVar5[uVar16].field_0 + lVar15 * 4 + 8);
              }
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
            if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) break;
            local_a0 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1];
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            bVar11 = false;
          }
        }
      } while (uVar18 != 0);
    }
    operator_delete__(__s);
    pxVar14 = xray_re::xr_scene::sound_envs(local_68->m_scene);
    this_01 = &(pxVar14->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,(long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&local_98,(EVP_PKEY_CTX *)"sound_env");
    local_60 = (cf_face *)
               local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (pptVar20 = local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
                    super__Vector_impl_data._M_start; (cf_face *)pptVar20 != local_60;
        pptVar20 = pptVar20 + 1) {
      ptVar13 = *pptVar20;
      this_00 = (xr_sound_env_object *)operator_new(200);
      xray_re::xr_sound_env_object::xr_sound_env_object(this_00,local_68->m_scene);
      pcVar9 = local_98.m_name;
      pcVar7 = (char *)(this_00->super_xr_shape_object).super_xr_custom_object.m_name.
                       _M_string_length;
      strlen(local_98.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(this_00->super_xr_shape_object).super_xr_custom_object.m_name,0,pcVar7,
                 (ulong)pcVar9);
      (this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0.field_0.z =
           (ptVar13->xform).field_0.field_0._43;
      *(undefined8 *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0 =
           *(undefined8 *)((long)&(ptVar13->xform).field_0 + 0x30);
      fVar1 = (ptVar13->xform).field_0.field_0._13;
      uVar18 = *(ulong *)&(ptVar13->xform).field_0;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar18;
      fVar2 = (ptVar13->xform).field_0.field_0._23;
      uVar19 = *(ulong *)((long)&(ptVar13->xform).field_0 + 0x10);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar19;
      fVar22 = (ptVar13->xform).field_0.field_0._33;
      uVar16 = *(ulong *)((long)&(ptVar13->xform).field_0 + 0x20);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar16;
      fVar24 = (float)(uVar16 >> 0x20);
      fVar25 = SQRT(fVar22 * fVar22 + (float)uVar16 * (float)uVar16 + fVar24 * fVar24);
      auVar8._4_4_ = fVar25;
      auVar8._0_4_ = fVar25;
      auVar8._8_8_ = 0;
      auVar28 = divps(auVar27,auVar8);
      *(long *)((long)&(ptVar13->xform).field_0 + 0x20) = auVar28._0_8_;
      (ptVar13->xform).field_0.field_0._33 = fVar22 / fVar25;
      fVar22 = (float)(uVar19 >> 0x20);
      fVar24 = (float)(uVar18 >> 0x20);
      auVar26._0_4_ = fVar1 * fVar1 + (float)uVar18 * (float)uVar18 + fVar24 * fVar24;
      auVar26._4_4_ = fVar2 * fVar2 + (float)uVar19 * (float)uVar19 + fVar22 * fVar22;
      auVar26._8_4_ = fVar24 * fVar24 + 0.0 + 0.0;
      auVar26._12_4_ = fVar22 * fVar22 + 0.0 + 0.0;
      auVar28 = sqrtps(auVar26,auVar26);
      fVar22 = auVar28._0_4_;
      fVar24 = auVar28._4_4_;
      auVar30._0_8_ = auVar28._0_8_;
      auVar30._8_4_ = fVar24;
      auVar30._12_4_ = fVar24;
      auVar29._8_8_ = auVar30._8_8_;
      auVar29._4_4_ = fVar22;
      auVar29._0_4_ = fVar22;
      auVar28 = divps(auVar23,auVar29);
      *(long *)&(ptVar13->xform).field_0 = auVar28._0_8_;
      (ptVar13->xform).field_0.field_0._13 = fVar1 / fVar22;
      auVar28._4_4_ = fVar24;
      auVar28._0_4_ = fVar24;
      auVar28._8_4_ = fVar24;
      auVar28._12_4_ = fVar24;
      auVar28 = divps(auVar21,auVar28);
      *(long *)((long)&(ptVar13->xform).field_0 + 0x10) = auVar28._0_8_;
      (ptVar13->xform).field_0.field_0._23 = fVar2 / fVar24;
      *(undefined8 *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0 =
           auVar30._0_8_;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.z = fVar25;
      xray_re::_matrix<float>::get_hpb
                (&ptVar13->xform,
                 &(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation.field_0.field_0
                  .y,(float *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation,
                 &(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation.field_0.field_0
                  .z);
      if (((ulong)((long)(pxVar4->m_env_ids).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pxVar4->m_env_ids).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)ptVar13->inner)
         || (std::__cxx11::string::_M_assign((string *)&this_00->m_inner),
            (ulong)((long)(pxVar4->m_env_ids).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pxVar4->m_env_ids).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)ptVar13->outer))
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::__cxx11::string::_M_assign((string *)&this_00->m_outer);
      operator_delete(ptVar13,0x4c);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_01,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&local_98);
    }
    xray_re::xr_level::clear_snd_env(local_68->m_level);
    operator_delete(local_98.m_name,1);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_envs()
{
	const xr_level_snd_env* snd_env = m_level->snd_env();
	if (snd_env == 0)
		return;
	msg("building %s", "sound_env.part");

	const cf_face_vec& faces = snd_env->faces();
	const cf_vertex_vec& verts = snd_env->vertices();

	std::vector<temp_box*> boxes;
	boxes.reserve(faces.size()/12);
	std::vector<uint32_t> adjacents;
	adjacents.reserve(12);

	uint32_t* groups = new uint32_t[faces.size()];
	xr_uninitialized_fill_n(groups, faces.size(), BAD_IDX);
	uint32_t group = 0;
	for (size_t k = faces.size(); k != 0;) {
		if (groups[--k] != BAD_IDX)
			continue;
		bool new_group = true;
		for (uint_fast32_t face_idx = uint_fast32_t(k & UINT32_MAX);;) {
			const cf_face& face = faces[face_idx];
			if (new_group) {
				boxes.push_back(new temp_box(face, verts));
				new_group = false;
			} else {
				boxes.back()->collect(face, verts);
			}
			groups[face_idx] = group;
			for (uint_fast32_t i = 3; i != 0;) {
				uint32_t v = face.v[--i];
				for (uint_fast32_t next = verts[v].face0; next != BAD_IDX;) {
					if (next != face_idx && groups[next] == BAD_IDX) {
						adjacents.push_back(uint32_t(next & UINT32_MAX));
						groups[next] = BAD_IDX;
					}
					next = faces[next].next_face_idx(v);
				}
			}
			if (adjacents.empty())
				break;
			face_idx = uint32_t(adjacents.back());
			adjacents.pop_back();
		}
	}
	delete[] groups;

	xr_custom_object_vec& cobjects = m_scene->sound_envs()->objects();
	cobjects.reserve(boxes.size());

	const std::vector<std::string>& env_ids = snd_env->env_ids();

	xr_name_gen name("sound_env");
	for (std::vector<temp_box*>::iterator it = boxes.begin(), end = boxes.end();
			it != end; ++it, name.next()) {
		temp_box* box = *it;
		xr_sound_env_object* new_sound_env = new xr_sound_env_object(*m_scene);
		new_sound_env->co_name() = name.get();
		new_sound_env->co_position() = box->xform.c;
		new_sound_env->co_scale().set(box->xform.i.normalize_magn(), box->xform.j.normalize_magn(),
			box->xform.k.normalize_magn());
		box->xform.get_xyz(new_sound_env->co_rotation());
		new_sound_env->inner() = env_ids.at(box->inner);
		new_sound_env->outer() = env_ids.at(box->outer);
		delete box;
		cobjects.push_back(new_sound_env);
	}
	m_level->clear_snd_env();
}